

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

void CB_EXPLORE_ADF::predict_or_learn_cover<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  byte bVar1;
  uint uVar2;
  v_array<ACTION_SCORE::action_score> *this;
  byte bVar3;
  reference ppeVar4;
  size_t sVar5;
  float *pfVar6;
  action_score *paVar7;
  reference pvVar8;
  action_score *paVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  ulong uVar10;
  v_array<ACTION_SCORE::action_score> *in_RDI;
  float fVar11;
  float fVar12;
  __type _Var13;
  float fVar14;
  size_t i_6;
  uint32_t action;
  size_t i_5;
  float add_prob;
  size_t tied_actions_1;
  uint32_t i_4;
  size_t i_3;
  float norm;
  size_t i_2;
  size_t tied_actions;
  uint32_t i_1;
  uint32_t i;
  v_array<ACTION_SCORE::action_score> *probs;
  float min_prob;
  float additive_probability;
  uint32_t num_actions;
  v_array<ACTION_SCORE::action_score> *preds;
  bool is_mtr;
  action_score *in_stack_fffffffffffffe88;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffed0;
  undefined1 update_zero_elements;
  float in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff20;
  float fVar15;
  ulong local_c8;
  ulong local_98;
  uint local_7c;
  action_score *local_78;
  ulong local_68;
  uint local_58;
  uint local_4c;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  uint local_2c;
  v_array<ACTION_SCORE::action_score> *local_28;
  undefined1 local_19;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  v_array<ACTION_SCORE::action_score> *local_8;
  
  local_19 = in_RDI[6]._begin == (action_score *)0x3;
  local_18 = in_RDX;
  local_8 = in_RDI;
  GEN_CS::gen_cs_example_ips
            ((multi_ex *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (label *)in_stack_fffffffffffffec8);
  LEARNER::multiline_learn_or_predict<false>
            ((multi_learner *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (multi_ex *)in_stack_fffffffffffffef8,
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffeec
            );
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
  local_28 = (v_array<ACTION_SCORE::action_score> *)&(*ppeVar4)->pred;
  sVar5 = v_array<ACTION_SCORE::action_score>::size(local_28);
  local_2c = (uint)sVar5;
  fVar14 = (float)(long)local_8[3].end_array;
  fVar15 = (float)local_8[3].end_array;
  local_30 = 1.0 / fVar15;
  local_38 = 1.0 / (float)(sVar5 & 0xffffffff);
  _Var13 = std::sqrt<unsigned_long>(0x3aa06d);
  local_3c = 1.0 / (float)_Var13;
  pfVar6 = std::min<float>(&local_38,&local_3c);
  this = local_8;
  local_34 = *pfVar6;
  v_array<ACTION_SCORE::action_score>::clear(in_stack_fffffffffffffe90);
  for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
    v_array<ACTION_SCORE::action_score>::push_back
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  std::vector<float,_std::allocator<float>_>::clear
            ((vector<float,_std::allocator<float>_> *)0x3aa133);
  for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
    in_stack_ffffffffffffff20 = local_8 + 1;
    v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_58);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (value_type_conflict5 *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)
              );
  }
  if (((ulong)local_8[4].end_array & 0x100) == 0) {
    sVar5 = fill_tied((cb_explore_adf *)
                      CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (v_array<ACTION_SCORE::action_score> *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    for (local_68 = 0; local_68 < sVar5; local_68 = local_68 + 1) {
      in_stack_ffffffffffffff18 = (float)(long)sVar5;
      in_stack_ffffffffffffff1c = (float)sVar5;
      in_stack_ffffffffffffff10 = local_30 / in_stack_ffffffffffffff1c;
      in_stack_ffffffffffffff08 = this;
      in_stack_ffffffffffffff14 = local_30;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_68);
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                         (in_stack_ffffffffffffff08,(ulong)paVar7->action);
      paVar7->score = in_stack_ffffffffffffff10 + paVar7->score;
    }
  }
  else {
    in_stack_fffffffffffffef8 = this;
    in_stack_ffffffffffffff04 = local_30;
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                       (in_stack_fffffffffffffef8,(ulong)paVar7->action);
    paVar7->score = in_stack_ffffffffffffff04 + paVar7->score;
  }
  for (local_78 = (action_score *)0x1;
      update_zero_elements = (undefined1)((uint)in_stack_fffffffffffffed0 >> 0x18),
      local_78 < local_8[3].end_array; local_78 = (action_score *)((long)&local_78->action + 1)) {
    GEN_CS::call_cs_ldf<false>
              ((multi_learner *)in_stack_ffffffffffffff20,
               (multi_ex *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (v_array<CB::label> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (label *)in_stack_ffffffffffffff08,
               (v_array<COST_SENSITIVE::label> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (uint64_t)in_stack_fffffffffffffef8,CONCAT44(fVar15,fVar14));
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,(ulong)local_7c);
      fVar11 = paVar7->score;
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 1),(ulong)local_7c);
      *pvVar8 = fVar11 + *pvVar8;
    }
    if (((ulong)local_8[4].end_array & 0x100) == 0) {
      sVar5 = fill_tied((cb_explore_adf *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (v_array<ACTION_SCORE::action_score> *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      fVar11 = local_30 / (float)sVar5;
      for (local_98 = 0; local_98 < sVar5; local_98 = local_98 + 1) {
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_98);
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)paVar7->action);
        if (paVar7->score < local_34) {
          in_stack_fffffffffffffec8 = this;
          in_stack_fffffffffffffed0 = local_34;
          in_stack_fffffffffffffed4 = fVar11;
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_98);
          paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                             (in_stack_fffffffffffffec8,(ulong)paVar7->action);
          fVar12 = in_stack_fffffffffffffed4 - (in_stack_fffffffffffffed0 - paVar7->score);
          uVar10 = (ulong)fVar12;
          max(0,uVar10 | (long)(fVar12 - 9.223372e+18) & (long)uVar10 >> 0x3f);
        }
        in_stack_fffffffffffffec4 = fVar11;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_98);
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)paVar7->action);
        paVar7->score = in_stack_fffffffffffffec4 + paVar7->score;
      }
    }
    else {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](local_28,0);
      uVar2 = paVar7->action;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
      if (paVar7->score < local_34) {
        in_stack_fffffffffffffea8 = local_34;
        in_stack_fffffffffffffeac = local_30;
        paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
        fVar11 = in_stack_fffffffffffffeac - (in_stack_fffffffffffffea8 - paVar7->score);
        uVar10 = (ulong)fVar11;
        max(0,uVar10 | (long)(fVar11 - 9.223372e+18) & (long)uVar10 >> 0x3f);
      }
      in_stack_fffffffffffffea4 = local_30;
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,(ulong)uVar2);
      paVar7->score = in_stack_fffffffffffffea4 + paVar7->score;
    }
  }
  bVar1 = *(byte *)((long)&local_8[3].erase_count + 4);
  bVar3 = bVar1 ^ 0xff;
  ACTION_SCORE::begin_scores
            ((action_scores *)(CONCAT17(bVar1,in_stack_fffffffffffffe98) ^ 0xff00000000000000));
  ACTION_SCORE::end_scores((action_scores *)CONCAT17(bVar3,in_stack_fffffffffffffe98));
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (in_stack_fffffffffffffed4,(bool)update_zero_elements,
             (score_iterator *)in_stack_fffffffffffffec8,
             (score_iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  do_sort((cb_explore_adf *)i_3);
  for (local_c8 = 0; local_c8 < local_2c; local_c8 = local_c8 + 1) {
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[](this,local_c8);
    paVar9 = v_array<ACTION_SCORE::action_score>::operator[](local_28,local_c8);
    *paVar9 = *paVar7;
  }
  local_8[5]._begin = (action_score *)((long)&(local_8[5]._begin)->action + 1);
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}